

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

nodeaddr_t __thiscall FpgaIO::GetPromAddress(FpgaIO *this,PromType type,bool isWrite)

{
  ostream *this_00;
  void *this_01;
  bool isWrite_local;
  PromType type_local;
  FpgaIO *this_local;
  
  if ((type == PROM_M25P16) && (isWrite)) {
    this_local = (FpgaIO *)0x8;
  }
  else if ((type != PROM_M25P16) || (isWrite)) {
    if ((type == PROM_25AA128) && (isWrite)) {
      this_local = (FpgaIO *)0x3000;
    }
    else if ((type != PROM_25AA128) || (isWrite)) {
      if ((type == PROM_25AA128_1) && (isWrite)) {
        this_local = (FpgaIO *)0x3010;
      }
      else if ((type != PROM_25AA128_1) || (isWrite)) {
        if ((type == PROM_25AA128_2) && (isWrite)) {
          this_local = (FpgaIO *)0x3020;
        }
        else if ((type != PROM_25AA128_2) || (isWrite)) {
          this_00 = std::operator<<((ostream *)&std::cerr,
                                    "FpgaIO::GetPromAddress: unsupported PROM type ");
          this_01 = (void *)std::ostream::operator<<(this_00,type);
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          this_local = (FpgaIO *)0x0;
        }
        else {
          this_local = (FpgaIO *)0x3022;
        }
      }
      else {
        this_local = (FpgaIO *)0x3012;
      }
    }
    else {
      this_local = (FpgaIO *)0x3002;
    }
  }
  else {
    this_local = (FpgaIO *)0x9;
  }
  return (nodeaddr_t)this_local;
}

Assistant:

nodeaddr_t FpgaIO::GetPromAddress(PromType type, bool isWrite)
{
    if (type == PROM_M25P16 && isWrite)
        return 0x0008;
    else if (type == PROM_M25P16 && !isWrite)
        return 0x0009;
    else if (type == PROM_25AA128 && isWrite)
        return 0x3000;
    else if (type == PROM_25AA128 && !isWrite)
        return 0x3002;
    else if (type == PROM_25AA128_1 && isWrite)
        return 0x3010;
    else if (type == PROM_25AA128_1 && !isWrite)
        return 0x3012;
    else if (type == PROM_25AA128_2 && isWrite)
        return 0x3020;
    else if (type == PROM_25AA128_2 && !isWrite)
        return 0x3022;
    else
        std::cerr << "FpgaIO::GetPromAddress: unsupported PROM type " << type << std::endl;

    return 0x00;
}